

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rawtransaction.cpp
# Opt level: O0

RPCHelpMan * combinerawtransaction(void)

{
  initializer_list<RPCArg> __l;
  initializer_list<RPCArg> __l_00;
  RPCHelpMan *in_RDI;
  undefined1 *puVar1;
  long in_FS_OFFSET;
  allocator<RPCArg> *in_stack_fffffffffffff868;
  allocator<RPCArg> *this;
  RPCArg *this_00;
  anon_class_1_0_00000001 *in_stack_fffffffffffff870;
  function<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&)> *in_stack_fffffffffffff878;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff880;
  string *in_stack_fffffffffffff898;
  string *in_stack_fffffffffffff8a0;
  allocator<char> *in_stack_fffffffffffff8a8;
  iterator in_stack_fffffffffffff8b0;
  RPCArgOptions *in_stack_fffffffffffff8b8;
  string *in_stack_fffffffffffff8c0;
  Fallback *in_stack_fffffffffffff8c8;
  undefined1 skip_type_check;
  string *in_stack_fffffffffffff8d0;
  undefined1 *puVar2;
  string *in_stack_fffffffffffff8d8;
  RPCArg *in_stack_fffffffffffff8e0;
  string *in_stack_fffffffffffff8e8;
  RPCArg *in_stack_fffffffffffff8f0;
  RPCArgOptions *in_stack_fffffffffffff910;
  RPCExamples *in_stack_fffffffffffff9b0;
  RPCResults *in_stack_fffffffffffff9b8;
  RPCHelpMan *args;
  string *in_stack_fffffffffffff9c8;
  _Alloc_hider in_stack_fffffffffffff9d0;
  RPCHelpMan *in_stack_fffffffffffff9d8;
  allocator<char> local_60a;
  allocator<char> local_609;
  pointer local_608;
  pointer pRStack_600;
  pointer local_5f8;
  allocator<char> local_5e2;
  allocator<char> local_5e1 [32];
  allocator<char> local_5c1 [8];
  allocator<char> local_5b9 [32];
  allocator<char> local_599;
  undefined4 local_598;
  allocator<char> local_591 [31];
  allocator<char> local_572;
  allocator<char> local_571 [65];
  RPCMethodImpl *in_stack_fffffffffffffad0;
  allocator<RPCArg> local_428 [40];
  undefined8 local_400;
  undefined8 uStack_3f8;
  undefined8 local_3f0;
  undefined1 local_3e8;
  undefined1 local_3e7;
  undefined1 local_3e0;
  undefined8 local_3b8;
  undefined8 uStack_3b0;
  undefined8 local_3a8;
  undefined1 local_3a0;
  undefined1 local_39f;
  undefined1 local_2f8 [264];
  undefined1 local_1f0 [160];
  undefined1 local_150 [264];
  undefined1 local_48 [64];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  args = in_RDI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff8b8,(char *)in_stack_fffffffffffff8b0,in_stack_fffffffffffff8a8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff8b8,(char *)in_stack_fffffffffffff8b0,in_stack_fffffffffffff8a8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff8b8,(char *)in_stack_fffffffffffff8b0,in_stack_fffffffffffff8a8);
  local_598._0_1_ = '\0';
  local_598._1_3_ = 0;
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<RPCArg::Optional,void,void,RPCArg::Optional,void>
            ((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)in_stack_fffffffffffff878,(Optional *)in_stack_fffffffffffff870);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff8b8,(char *)in_stack_fffffffffffff8b0,in_stack_fffffffffffff8a8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff8b8,(char *)in_stack_fffffffffffff8b0,in_stack_fffffffffffff8a8);
  local_5c1[1] = (allocator<char>)0x1;
  local_5c1[2] = (allocator<char>)0x0;
  local_5c1[3] = (allocator<char>)0x0;
  local_5c1[4] = (allocator<char>)0x0;
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<RPCArg::Optional,void,void,RPCArg::Optional,void>
            ((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)in_stack_fffffffffffff878,(Optional *)in_stack_fffffffffffff870);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff8b8,(char *)in_stack_fffffffffffff8b0,in_stack_fffffffffffff8a8);
  local_3e0 = 0;
  std::__cxx11::string::string(in_stack_fffffffffffff880);
  local_3b8 = 0;
  uStack_3b0 = 0;
  local_3a8 = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_stack_fffffffffffff868);
  local_3a0 = 0;
  local_39f = 0;
  RPCArg::RPCArg(in_stack_fffffffffffff8e0,in_stack_fffffffffffff8d8,
                 (Type)((ulong)in_stack_fffffffffffff8d0 >> 0x20),in_stack_fffffffffffff8c8,
                 in_stack_fffffffffffff8c0,in_stack_fffffffffffff8b8);
  std::allocator<RPCArg>::allocator(in_stack_fffffffffffff868);
  __l._M_len = (size_type)in_stack_fffffffffffff8b8;
  __l._M_array = in_stack_fffffffffffff8b0;
  std::vector<RPCArg,_std::allocator<RPCArg>_>::vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)in_stack_fffffffffffff8a8,__l,
             (allocator_type *)in_stack_fffffffffffff8a0);
  local_428[0] = (allocator<RPCArg>)0x0;
  std::__cxx11::string::string(in_stack_fffffffffffff880);
  local_400 = 0;
  uStack_3f8 = 0;
  local_3f0 = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_stack_fffffffffffff868);
  local_3e8 = 0;
  local_3e7 = 0;
  this = local_428;
  RPCArg::RPCArg(in_stack_fffffffffffff8f0,in_stack_fffffffffffff8e8,
                 (Type)((ulong)in_stack_fffffffffffff8e0 >> 0x20),
                 (Fallback *)in_stack_fffffffffffff8d8,in_stack_fffffffffffff8d0,
                 (vector<RPCArg,_std::allocator<RPCArg>_> *)in_stack_fffffffffffff8c8,
                 in_stack_fffffffffffff910);
  skip_type_check = (undefined1)((ulong)in_stack_fffffffffffff8c8 >> 0x38);
  std::allocator<RPCArg>::allocator(this);
  __l_00._M_len = (size_type)in_stack_fffffffffffff8b8;
  __l_00._M_array = in_stack_fffffffffffff8b0;
  std::vector<RPCArg,_std::allocator<RPCArg>_>::vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)in_stack_fffffffffffff8a8,__l_00,
             (allocator_type *)in_stack_fffffffffffff8a0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff8b8,(char *)in_stack_fffffffffffff8b0,in_stack_fffffffffffff8a8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff8b8,(char *)in_stack_fffffffffffff8b0,in_stack_fffffffffffff8a8);
  local_608 = (pointer)0x0;
  pRStack_600 = (pointer)0x0;
  local_5f8 = (pointer)0x0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)this);
  RPCResult::RPCResult
            ((RPCResult *)in_stack_fffffffffffff8f0,(Type)((ulong)in_stack_fffffffffffff8e8 >> 0x20)
             ,&in_stack_fffffffffffff8e0->m_names,in_stack_fffffffffffff8d8,
             (vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffff8d0,
             (bool)skip_type_check);
  RPCResults::RPCResults
            ((RPCResults *)in_stack_fffffffffffff8e8,(RPCResult *)in_stack_fffffffffffff8e0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff8b8,(char *)in_stack_fffffffffffff8b0,in_stack_fffffffffffff8a8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff8b8,(char *)in_stack_fffffffffffff8b0,in_stack_fffffffffffff8a8);
  HelpExampleCli(in_stack_fffffffffffff8a0,in_stack_fffffffffffff898);
  RPCExamples::RPCExamples((RPCExamples *)this,(string *)0x13a3193);
  this_00 = (RPCArg *)&stack0xfffffffffffff9d0;
  std::function<UniValue(RPCHelpMan_const&,JSONRPCRequest_const&)>::
  function<combinerawtransaction()::__0,void>(in_stack_fffffffffffff878,in_stack_fffffffffffff870);
  RPCHelpMan::RPCHelpMan
            (in_stack_fffffffffffff9d8,(string *)in_stack_fffffffffffff9d0._M_p,
             in_stack_fffffffffffff9c8,(vector<RPCArg,_std::allocator<RPCArg>_> *)args,
             in_stack_fffffffffffff9b8,in_stack_fffffffffffff9b0,in_stack_fffffffffffffad0);
  std::function<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&)>::~function
            ((function<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&)> *)this_00);
  RPCExamples::~RPCExamples((RPCExamples *)this_00);
  std::__cxx11::string::~string(&this_00->m_names);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_60a);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_609);
  RPCResults::~RPCResults((RPCResults *)this_00);
  RPCResult::~RPCResult((RPCResult *)this_00);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffff878);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_5e2);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(local_5e1);
  std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)in_stack_fffffffffffff878);
  std::allocator<RPCArg>::~allocator((allocator<RPCArg> *)this_00);
  puVar2 = local_150;
  puVar1 = local_48;
  do {
    puVar1 = puVar1 + -0x108;
    RPCArg::~RPCArg(this_00);
  } while (puVar1 != puVar2);
  RPCArgOptions::~RPCArgOptions((RPCArgOptions *)this_00);
  std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)in_stack_fffffffffffff878);
  std::allocator<RPCArg>::~allocator((allocator<RPCArg> *)this_00);
  puVar2 = local_2f8;
  puVar1 = local_1f0;
  do {
    puVar1 = puVar1 + -0x108;
    RPCArg::~RPCArg(this_00);
  } while (puVar1 != puVar2);
  RPCArgOptions::~RPCArgOptions((RPCArgOptions *)this_00);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(local_5c1);
  std::
  variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~variant((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)this_00);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(local_5b9);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_599);
  std::
  variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~variant((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)this_00);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(local_591);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_572);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(local_571);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

static RPCHelpMan combinerawtransaction()
{
    return RPCHelpMan{"combinerawtransaction",
                "\nCombine multiple partially signed transactions into one transaction.\n"
                "The combined transaction may be another partially signed transaction or a \n"
                "fully signed transaction.",
                {
                    {"txs", RPCArg::Type::ARR, RPCArg::Optional::NO, "The hex strings of partially signed transactions",
                        {
                            {"hexstring", RPCArg::Type::STR_HEX, RPCArg::Optional::OMITTED, "A hex-encoded raw transaction"},
                        },
                        },
                },
                RPCResult{
                    RPCResult::Type::STR, "", "The hex-encoded raw transaction with signature(s)"
                },
                RPCExamples{
                    HelpExampleCli("combinerawtransaction", R"('["myhex1", "myhex2", "myhex3"]')")
                },
        [&](const RPCHelpMan& self, const JSONRPCRequest& request) -> UniValue
{

    UniValue txs = request.params[0].get_array();
    std::vector<CMutableTransaction> txVariants(txs.size());

    for (unsigned int idx = 0; idx < txs.size(); idx++) {
        if (!DecodeHexTx(txVariants[idx], txs[idx].get_str())) {
            throw JSONRPCError(RPC_DESERIALIZATION_ERROR, strprintf("TX decode failed for tx %d. Make sure the tx has at least one input.", idx));
        }
    }

    if (txVariants.empty()) {
        throw JSONRPCError(RPC_DESERIALIZATION_ERROR, "Missing transactions");
    }

    // mergedTx will end up with all the signatures; it
    // starts as a clone of the rawtx:
    CMutableTransaction mergedTx(txVariants[0]);

    // Fetch previous transactions (inputs):
    CCoinsView viewDummy;
    CCoinsViewCache view(&viewDummy);
    {
        NodeContext& node = EnsureAnyNodeContext(request.context);
        const CTxMemPool& mempool = EnsureMemPool(node);
        ChainstateManager& chainman = EnsureChainman(node);
        LOCK2(cs_main, mempool.cs);
        CCoinsViewCache &viewChain = chainman.ActiveChainstate().CoinsTip();
        CCoinsViewMemPool viewMempool(&viewChain, mempool);
        view.SetBackend(viewMempool); // temporarily switch cache backend to db+mempool view

        for (const CTxIn& txin : mergedTx.vin) {
            view.AccessCoin(txin.prevout); // Load entries from viewChain into view; can fail.
        }

        view.SetBackend(viewDummy); // switch back to avoid locking mempool for too long
    }

    // Use CTransaction for the constant parts of the
    // transaction to avoid rehashing.
    const CTransaction txConst(mergedTx);
    // Sign what we can:
    for (unsigned int i = 0; i < mergedTx.vin.size(); i++) {
        CTxIn& txin = mergedTx.vin[i];
        const Coin& coin = view.AccessCoin(txin.prevout);
        if (coin.IsSpent()) {
            throw JSONRPCError(RPC_VERIFY_ERROR, "Input not found or already spent");
        }
        SignatureData sigdata;

        // ... and merge in other signatures:
        for (const CMutableTransaction& txv : txVariants) {
            if (txv.vin.size() > i) {
                sigdata.MergeSignatureData(DataFromTransaction(txv, i, coin.out));
            }
        }
        ProduceSignature(DUMMY_SIGNING_PROVIDER, MutableTransactionSignatureCreator(mergedTx, i, coin.out.nValue, 1), coin.out.scriptPubKey, sigdata);

        UpdateInput(txin, sigdata);
    }

    return EncodeHexTx(CTransaction(mergedTx));
},
    };
}